

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexycal.cpp
# Opt level: O2

int found_token_and_check_for_reserved_word(void)

{
  int iVar1;
  Symbol *pSVar2;
  
  lexemeBuffer[(long)lexemeLength + -1] = '\0';
  pSVar2 = SymbolTable::cSearch(&reservedWordsTable.super_SymbolTable,lexemeBuffer);
  if (pSVar2 == (Symbol *)0x0) {
    IdsTable::cInsert(&identifiersTable,lexemeBuffer);
    iVar1 = 10;
  }
  else {
    iVar1 = *(int *)&pSVar2[1]._vptr_Symbol;
  }
  iVar1 = found_token_and_restart(iVar1);
  return iVar1;
}

Assistant:

int found_token_and_check_for_reserved_word() {
    remove_last_char_from_lexeme();

//    int token = reservedWordsTable.cSearch(lexemeBuffer);
    ReservedTokenSymbol *token = reservedWordsTable.cSearch(lexemeBuffer);

    if (token != nullptr) {
        return found_token_and_restart(token->getTokenID());
    } else {
        identifiersTable.cInsert(lexemeBuffer);
        return found_token_and_restart(ID);
    }
}